

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

void __thiscall
llvm::raw_fd_ostream::raw_fd_ostream(raw_fd_ostream *this,StringRef Filename,error_code *EC)

{
  CreationDisposition in_R8D;
  FileAccess in_R9D;
  OpenFlags in_stack_ffffffffffffffe8;
  
  raw_fd_ostream(this,Filename,EC,in_R8D,in_R9D,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

raw_fd_ostream::raw_fd_ostream(StringRef Filename, std::error_code &EC)
    : raw_fd_ostream(Filename, EC, sys::fs::CD_CreateAlways, sys::fs::FA_Write,
                     sys::fs::OF_None) {}